

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O0

Aig_Obj_t * Dar_RefactBuildGraph(Aig_Man_t *pAig,Vec_Ptr_t *vCut,Kit_Graph_t *pGraph)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  void *pvVar3;
  Kit_Node_t *pKVar4;
  Aig_Obj_t *p1;
  int local_44;
  Kit_Node_t *pKStack_40;
  int i;
  Kit_Node_t *pNode;
  Aig_Obj_t *pAnd1;
  Aig_Obj_t *pAnd0;
  Kit_Graph_t *pGraph_local;
  Vec_Ptr_t *vCut_local;
  Aig_Man_t *pAig_local;
  
  pKStack_40 = (Kit_Node_t *)0x0;
  iVar1 = Kit_GraphIsConst(pGraph);
  if (iVar1 == 0) {
    for (local_44 = 0; local_44 < pGraph->nLeaves; local_44 = local_44 + 1) {
      pKStack_40 = Kit_GraphNode(pGraph,local_44);
      pvVar3 = Vec_PtrEntry(vCut,local_44);
      (pKStack_40->field_2).pFunc = pvVar3;
    }
    iVar1 = Kit_GraphIsVar(pGraph);
    if (iVar1 == 0) {
      for (local_44 = pGraph->nLeaves; local_44 < pGraph->nSize; local_44 = local_44 + 1) {
        pKStack_40 = Kit_GraphNode(pGraph,local_44);
        pKVar4 = Kit_GraphNode(pGraph,(uint)pKStack_40->eEdge0 >> 1 & 0x3fffffff);
        pAVar2 = Aig_NotCond((Aig_Obj_t *)(pKVar4->field_2).pFunc,(uint)pKStack_40->eEdge0 & 1);
        pKVar4 = Kit_GraphNode(pGraph,(uint)pKStack_40->eEdge1 >> 1 & 0x3fffffff);
        p1 = Aig_NotCond((Aig_Obj_t *)(pKVar4->field_2).pFunc,(uint)pKStack_40->eEdge1 & 1);
        pAVar2 = Aig_And(pAig,pAVar2,p1);
        (pKStack_40->field_2).pFunc = pAVar2;
      }
      pAVar2 = (Aig_Obj_t *)(pKStack_40->field_2).pFunc;
      iVar1 = Kit_GraphIsComplement(pGraph);
      pAig_local = (Aig_Man_t *)Aig_NotCond(pAVar2,iVar1);
    }
    else {
      pKVar4 = Kit_GraphVar(pGraph);
      pAVar2 = (Aig_Obj_t *)(pKVar4->field_2).pFunc;
      iVar1 = Kit_GraphIsComplement(pGraph);
      pAig_local = (Aig_Man_t *)Aig_NotCond(pAVar2,iVar1);
    }
  }
  else {
    pAVar2 = Aig_ManConst1(pAig);
    iVar1 = Kit_GraphIsComplement(pGraph);
    pAig_local = (Aig_Man_t *)Aig_NotCond(pAVar2,iVar1);
  }
  return (Aig_Obj_t *)pAig_local;
}

Assistant:

Aig_Obj_t * Dar_RefactBuildGraph( Aig_Man_t * pAig, Vec_Ptr_t * vCut, Kit_Graph_t * pGraph )
{
    Aig_Obj_t * pAnd0, * pAnd1;
    Kit_Node_t * pNode = NULL;
    int i;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Aig_NotCond( Aig_ManConst1(pAig), Kit_GraphIsComplement(pGraph) );
    // set the leaves
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = Vec_PtrEntry(vCut, i);
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Aig_NotCond( (Aig_Obj_t *)Kit_GraphVar(pGraph)->pFunc, Kit_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
//printf( "Building (current number %d):\n", Aig_ManObjNumMax(pAig) );
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Aig_NotCond( (Aig_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Aig_NotCond( (Aig_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Aig_And( pAig, pAnd0, pAnd1 );
/*
printf( "Checking " );
Ref_ObjPrint( pAnd0 );
printf( " and " );
Ref_ObjPrint( pAnd1 );
printf( "  Result " );
Ref_ObjPrint( pNode->pFunc );
printf( "\n" );
*/
    }
    // complement the result if necessary
    return Aig_NotCond( (Aig_Obj_t *)pNode->pFunc, Kit_GraphIsComplement(pGraph) );
}